

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

CappedArray<char,_32UL> * __thiscall
kj::_::Stringifier::operator*
          (CappedArray<char,_32UL> *__return_storage_ptr__,Stringifier *this,double f)

{
  char *pcVar1;
  size_t s;
  CappedArray<char,_32UL> *result;
  double f_local;
  Stringifier *this_local;
  
  CappedArray<char,_32UL>::CappedArray(__return_storage_ptr__);
  pcVar1 = CappedArray<char,_32UL>::begin(__return_storage_ptr__);
  pcVar1 = anon_unknown_0::DoubleToBuffer(f,pcVar1);
  s = strlen(pcVar1);
  CappedArray<char,_32UL>::setSize(__return_storage_ptr__,s);
  return __return_storage_ptr__;
}

Assistant:

CappedArray<char, kDoubleToBufferSize> Stringifier::operator*(double f) const {
  CappedArray<char, kDoubleToBufferSize> result;
  result.setSize(strlen(DoubleToBuffer(f, result.begin())));
  return result;
}